

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O1

bool __thiscall cmCTest::SetTest(cmCTest *this,char *ttype,bool report)

{
  int iVar1;
  Part PVar2;
  size_t sVar3;
  long lVar4;
  ostringstream cmCTestLog_msg;
  undefined1 auStack_1c8 [7];
  allocator local_1c1;
  string local_1c0;
  undefined1 local_1a0 [112];
  ios_base local_130 [264];
  
  std::__cxx11::string::string((string *)&local_1c0,ttype,&local_1c1);
  cmsys::SystemTools::LowerCase((string *)local_1a0,&local_1c0);
  iVar1 = std::__cxx11::string::compare(local_1a0);
  if ((undefined1 *)local_1a0._0_8_ != local_1a0 + 0x10) {
    operator_delete((void *)local_1a0._0_8_,local_1a0._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
    operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
  }
  if (iVar1 == 0) {
    lVar4 = 0;
    do {
      (&this->Parts[0].Enabled)[lVar4] = true;
      lVar4 = lVar4 + 0x40;
    } while (lVar4 != 0x2c0);
  }
  else {
    PVar2 = GetPartFromName(this,ttype);
    if (PVar2 == PartCount) {
      if (report) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a0,"Don\'t know about test \"",0x17);
        if (ttype == (char *)0x0) {
          std::ios::clear((int)auStack_1c8 + (int)*(undefined8 *)(local_1a0._0_8_ + -0x18) + 0x28);
        }
        else {
          sVar3 = strlen(ttype);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,ttype,sVar3);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"\" yet...",8);
        std::ios::widen((char)(ostream *)local_1a0 + (char)*(undefined8 *)(local_1a0._0_8_ + -0x18))
        ;
        std::ostream::put((char)local_1a0);
        std::ostream::flush();
        std::__cxx11::stringbuf::str();
        Log(this,6,
            "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/cmCTest.cxx"
            ,0x37b,local_1c0._M_dataplus._M_p,false);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
          operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a0);
        std::ios_base::~ios_base(local_130);
      }
      return false;
    }
    this->Parts[PVar2].Enabled = true;
  }
  return true;
}

Assistant:

bool cmCTest::SetTest(const char* ttype, bool report)
{
  if ( cmSystemTools::LowerCase(ttype) == "all" )
    {
    for(Part p = PartStart; p != PartCount; p = Part(p+1))
      {
      this->Parts[p].Enable();
      }
    return true;
    }
  Part p = this->GetPartFromName(ttype);
  if(p != PartCount)
    {
    this->Parts[p].Enable();
    return true;
    }
  else
    {
    if ( report )
      {
      cmCTestLog(this, ERROR_MESSAGE, "Don't know about test \"" << ttype
        << "\" yet..." << std::endl);
      }
    return false;
    }
}